

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackRPMGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackRPMGenerator *this,string *componentName)

{
  ComponentPackageMethod CVar1;
  bool bVar2;
  cmValue r;
  string *psVar3;
  string groupVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
  if (CVar1 == ONE_PACKAGE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ALL_COMPONENTS_IN_ONE",(allocator<char> *)&local_80
              );
  }
  else if (CVar1 == ONE_PACKAGE_PER_COMPONENT) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
  }
  else {
    cmsys::SystemTools::UpperCase(&local_40,componentName);
    std::operator+(&local_60,"CPACK_COMPONENT_",&local_40);
    std::operator+(&local_80,&local_60,"_GROUP");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    r = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_80);
    bVar2 = ::operator!=((cmValue)0x0,r);
    if (bVar2) {
      psVar3 = (string *)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_80);
      if (psVar3 == (string *)0x0) {
        psVar3 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
    }
    else {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)componentName);
    }
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackRPMGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  if (this->componentPackageMethod == ONE_PACKAGE_PER_COMPONENT) {
    return componentName;
  }

  if (this->componentPackageMethod == ONE_PACKAGE) {
    return { "ALL_COMPONENTS_IN_ONE" };
  }
  // We have to find the name of the COMPONENT GROUP
  // the current COMPONENT belongs to.
  std::string groupVar =
    "CPACK_COMPONENT_" + cmSystemTools::UpperCase(componentName) + "_GROUP";
  if (nullptr != this->GetOption(groupVar)) {
    return std::string(this->GetOption(groupVar));
  }
  return componentName;
}